

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O1

void zt_log_lprintf(zt_log_ty *log,zt_log_level level,char *fmt,...)

{
  char in_AL;
  zt_log_ctx_ty *pzVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (((log != (zt_log_ty *)0x0) || (log = zt_log_get_logger(), log != (zt_log_ty *)0x0)) &&
     (level <= log->level)) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_e8.gp_offset = 0x18;
    local_e8.fp_offset = 0x30;
    zt_log_lvprintf(log,level,fmt,&local_e8);
    return;
  }
  pzVar1 = zt_log_get_ctx();
  pzVar1->file = (char *)0x0;
  pzVar1->line = -1;
  pzVar1->function = (char *)0x0;
  return;
}

Assistant:

void
zt_log_lprintf(zt_log_ty * log, zt_log_level level, const char * fmt, ...) {
    va_list ap;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }

    if (level > log->level) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }
    va_start(ap, fmt);
    zt_log_lvprintf(log, level, fmt, ap);
    va_end(ap);
}